

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomNameVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::AtomNameVisitor::visitAtom(AtomNameVisitor *this,Atom *atom)

{
  bool bVar1;
  ostream *this_00;
  AtomType *pAVar2;
  size_type sVar3;
  element_type *this_01;
  _Base_ptr in_RSI;
  AtomData *in_RDI;
  string bn;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb;
  AtomType *at;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  iterator i;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::AtomData> atomData;
  AtomType *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  StuntDouble *in_stack_fffffffffffffea8;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *this_02;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  _Base_ptr __a;
  string *at_00;
  ForceField *in_stack_fffffffffffffee0;
  string local_110 [32];
  undefined1 local_f0 [8];
  AtomType *in_stack_ffffffffffffff18;
  string local_98 [71];
  undefined1 local_51 [65];
  _Base_ptr local_10;
  
  local_10 = in_RSI;
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x345611);
  at_00 = (string *)local_51;
  __a = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffee0,(char *)at_00,(allocator<char> *)__a);
  StuntDouble::getPropertyByName(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe98);
  if (bVar1) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>(in_stack_fffffffffffffeb8);
    std::shared_ptr<OpenMD::AtomData>::operator=
              ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffea0,
               (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe98);
    std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x3456d2);
    bVar1 = std::operator==((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe98);
    if (bVar1) {
      in_stack_fffffffffffffec0 =
           std::operator<<((ostream *)&std::cerr,"can not get Atom Data from ");
      (**(code **)(*(long *)local_10 + 0x38))(local_98);
      this_00 = std::operator<<(in_stack_fffffffffffffec0,local_98);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_98);
      std::make_shared<OpenMD::AtomData>();
      std::shared_ptr<OpenMD::AtomData>::operator=
                ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffea0,
                 (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe98);
      std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34578b);
    }
  }
  else {
    std::make_shared<OpenMD::AtomData>();
    std::shared_ptr<OpenMD::AtomData>::operator=
              ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffea0,
               (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe98);
    std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34584b);
  }
  this_02 = (vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
            &stack0xffffffffffffff40;
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  ::__normal_iterator((__normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
                       *)this_02);
  std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x34586a);
  AtomData::beginAtomInfo(in_RDI,(iterator *)in_stack_fffffffffffffec0);
  while (bVar1 = std::operator!=((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffea0,
                                 in_stack_fffffffffffffe98), bVar1) {
    in_stack_fffffffffffffea0 =
         (string *)
         (in_RDI->data).
         super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3458c5);
    pAVar2 = ForceField::getAtomType(in_stack_fffffffffffffee0,at_00);
    if (pAVar2 != (AtomType *)0x0) {
      AtomType::allYourBase(in_stack_ffffffffffffff18);
      in_stack_fffffffffffffe98 = (AtomType *)local_f0;
      sVar3 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size
                        ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                         in_stack_fffffffffffffe98);
      std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
                ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                 in_stack_fffffffffffffe98,sVar3 - 1);
      AtomType::getName_abi_cxx11_(in_stack_fffffffffffffe98);
      this_01 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x345942);
      std::__cxx11::string::operator=((string *)this_01,local_110);
      std::__cxx11::string::~string(local_110);
      std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector(this_02);
    }
    std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3459cf);
    AtomData::nextAtomInfo(in_RDI,(iterator *)in_stack_fffffffffffffec0);
    std::shared_ptr<OpenMD::AtomInfo>::operator=
              ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffea0,
               (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe98);
    std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x345a02);
  }
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x3458a5);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x345a23);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x345a30);
  return;
}

Assistant:

void AtomNameVisitor::visitAtom(Atom* atom) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<GenericData> data = atom->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);
      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << atom->getType()
                  << std::endl;
        atomData = std::make_shared<AtomData>();
      }
    } else {
      atomData = std::make_shared<AtomData>();
    }

    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    for (std::shared_ptr<AtomInfo> atomInfo = atomData->beginAtomInfo(i);
         atomInfo != nullptr; atomInfo      = atomData->nextAtomInfo(i)) {
      // query the force field for the AtomType associated with this
      // atomTypeName:
      AtomType* at = ff_->getAtomType(atomInfo->atomTypeName);
      // Sometimes the atomInfo is set to a fictitious type, so we'll
      // only do base replacement if this AtomType is known in the forceField:
      if (at != NULL) {
        // get the chain of base types for this atom type:
        std::vector<AtomType*> ayb = at->allYourBase();
        // use the last type in the chain of base types for the name:
        std::string bn = ayb[ayb.size() - 1]->getName();

        atomInfo->atomTypeName = bn;
      }
    }
  }